

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

uint anchorNameHash(ctmbstr s)

{
  uint uVar1;
  uint uVar2;
  
  if (s != (ctmbstr)0x0) {
    uVar2 = 0;
    for (; *s != '\0'; s = s + 1) {
      uVar1 = prvTidyToLower((int)*s);
      uVar2 = uVar2 * 0x1f + (int)(char)uVar1;
    }
    return uVar2 % 0x3fd;
  }
  return 0;
}

Assistant:

static uint anchorNameHash(ctmbstr s)
{
    uint hashval = 0;
    /* Issue #149 - an inferred name can be null. avoid crash */
    if (s) 
    {
        for ( ; *s != '\0'; s++) {
            tmbchar c = TY_(ToLower)( *s );
            hashval = c + 31*hashval;
        }
    }
    return hashval % ANCHOR_HASH_SIZE;
}